

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O1

void poly1305_auth(uchar *out,uchar *m,size_t inlen,uchar *key)

{
  byte bVar1;
  uint3 uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  uchar mp [16];
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  uint local_7c;
  ulong local_70;
  ulong *local_68;
  uchar *local_60;
  uchar *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  uVar2 = *(uint3 *)key;
  bVar1 = key[3];
  uVar18 = ((uint)*(uint3 *)(key + 4) << 6 | (uint)(bVar1 >> 2)) & 0x3ffff03;
  local_38 = (ulong)uVar18;
  uVar19 = ((uint)*(ushort *)(key + 8) << 0xc |
           ((uint)key[7] << 0x18 | (uint)key[6] << 0x10) >> 0x14) & 0x3ffc0ff;
  local_40 = (ulong)uVar19;
  uVar20 = ((uint)key[0xc] << 0x12 |
           ((uint)key[0xb] << 0x18 | (uint)key[10] << 0x10 | (uint)key[9] << 8) >> 0xe) & 0x3f03fff;
  local_48 = (ulong)uVar20;
  uVar5 = (key[0xf] & 0xf) << 0x10 | (uint)key[0xe] << 8 | (uint)key[0xd];
  local_50 = (ulong)uVar5;
  uVar6 = 0;
  uVar15 = 0;
  uVar12 = 0;
  uVar3 = 0;
  uVar13 = 0;
  local_60 = key;
  local_58 = out;
  if (inlen < 0x10) goto LAB_0011dfcc;
  do {
    local_68 = (ulong *)((long)m + 0x10);
    local_70 = inlen - 0x10;
    uVar13 = ((uint)*(ulong *)m & 0x3ffffff) + uVar13;
    uVar3 = ((uint)(*(ulong *)m >> 0x1a) & 0x3ffffff) + uVar3;
    uVar12 = ((uint)(*(ulong *)((long)m + 4) >> 0x14) & 0x3ffffff) + uVar12;
    uVar15 = ((uint)(*(ulong *)((long)m + 8) >> 0xe) & 0x3ffffff) + uVar15;
    uVar6 = (*(uint *)((long)m + 0xc) >> 8) + uVar6 + 0x1000000;
    while( true ) {
      uVar28 = (ulong)uVar13;
      uVar14 = (ulong)((bVar1 & 3) << 0x18 | (uint)uVar2);
      uVar21 = (ulong)uVar3;
      uVar4 = (ulong)(uVar5 * 5);
      uVar9 = (ulong)uVar12;
      uVar10 = (ulong)(uVar20 * 5);
      uVar26 = (ulong)uVar15;
      uVar11 = (ulong)(uVar19 * 5);
      uVar7 = (ulong)uVar6;
      uVar16 = (uVar18 * 5) * uVar7 + uVar26 * uVar11 + uVar9 * uVar10 + uVar21 * uVar4 +
               uVar28 * uVar14;
      uVar23 = local_38 & 0xffffffff;
      uVar24 = local_40 & 0xffffffff;
      uVar17 = (uVar16 >> 0x1a) +
               uVar11 * uVar7 + uVar26 * uVar10 + uVar9 * uVar4 + uVar21 * uVar14 + uVar28 * uVar23;
      uVar10 = (uVar17 >> 0x1a & 0xffffffff) +
               uVar10 * uVar7 + uVar26 * uVar4 + uVar9 * uVar14 + uVar21 * uVar23 + uVar28 * uVar24;
      uVar11 = (uVar10 >> 0x1a & 0xffffffff) +
               uVar4 * uVar7 + uVar26 * uVar14 + uVar9 * uVar23 + uVar21 * uVar24 +
               uVar28 * (local_48 & 0xffffffff);
      uVar4 = (uVar11 >> 0x1a & 0xffffffff) +
              uVar7 * uVar14 + uVar26 * uVar23 + uVar9 * uVar24 + uVar21 * (local_48 & 0xffffffff) +
              (local_50 & 0xffffffff) * uVar28;
      uVar3 = (uint)uVar17 & 0x3ffffff;
      uVar12 = (uint)uVar10 & 0x3ffffff;
      uVar15 = (uint)uVar11 & 0x3ffffff;
      uVar6 = (uint)uVar4 & 0x3ffffff;
      uVar13 = (int)(uVar4 >> 0x1a) * 5 + ((uint)uVar16 & 0x3ffffff);
      inlen = local_70;
      m = (uchar *)local_68;
      if (0xf < local_70) break;
LAB_0011dfcc:
      if (inlen == 0) {
        uVar3 = (uVar13 >> 0x1a) + uVar3;
        uVar12 = (uVar3 >> 0x1a) + uVar12;
        uVar5 = uVar12 & 0x3ffffff;
        uVar15 = (uVar12 >> 0x1a) + uVar15;
        uVar18 = uVar15 & 0x3ffffff;
        uVar6 = (uVar15 >> 0x1a) + uVar6;
        uVar25 = (uVar6 >> 0x1a) * 5 + (uVar13 & 0x3ffffff);
        uVar20 = (uVar25 >> 0x1a) + (uVar3 & 0x3ffffff);
        uVar25 = uVar25 & 0x3ffffff;
        uVar3 = uVar25 + 5;
        uVar19 = (uVar3 >> 0x1a) + uVar20;
        uVar15 = (uVar19 >> 0x1a) + uVar5;
        uVar13 = (uVar15 >> 0x1a) + uVar18;
        uVar22 = uVar13 >> 0x1a;
        uVar27 = (int)(uVar22 + (uVar6 & 0x3ffffff) + -0x4000000) >> 0x1f;
        uVar12 = 0xffffffff - uVar27 & 0x3ffffff;
        uVar19 = uVar19 & uVar12 | uVar20 & uVar27;
        uVar15 = uVar15 & uVar12 | uVar5 & uVar27;
        uVar13 = uVar12 & uVar13 | uVar18 & uVar27;
        uVar5 = *(uint *)(local_60 + 0x14);
        uVar4 = (ulong)*(uint *)(local_60 + 0x10) +
                (ulong)(uVar19 << 0x1a | uVar3 & uVar12 | uVar25 & uVar27);
        uVar3 = *(uint *)(local_60 + 0x18);
        uVar12 = *(uint *)(local_60 + 0x1c);
        *local_58 = (uchar)uVar4;
        local_58[1] = (uchar)(uVar4 >> 8);
        local_58[2] = (uchar)(uVar4 >> 0x10);
        local_58[3] = (uchar)(uVar4 >> 0x18);
        uVar4 = (uVar4 >> 0x20) + (ulong)uVar5 + (ulong)(uVar15 << 0x14 | uVar19 >> 6);
        local_58[4] = (uchar)uVar4;
        local_58[5] = (uchar)(uVar4 >> 8);
        local_58[6] = (uchar)(uVar4 >> 0x10);
        local_58[7] = (uchar)(uVar4 >> 0x18);
        uVar4 = (uVar4 >> 0x20) + (ulong)uVar3 + (ulong)(uVar13 << 0xe | uVar15 >> 0xc);
        local_58[8] = (uchar)uVar4;
        local_58[9] = (uchar)(uVar4 >> 8);
        local_58[10] = (uchar)(uVar4 >> 0x10);
        local_58[0xb] = (uchar)(uVar4 >> 0x18);
        lVar8 = (uVar4 >> 0x20) +
                (ulong)uVar12 +
                (ulong)((0xffffffff - uVar27 & uVar22 + (uVar6 & 0x3ffffff) | uVar27 & uVar6) << 8 |
                       uVar13 >> 0x12);
        local_58[0xc] = (uchar)lVar8;
        local_58[0xd] = (uchar)((ulong)lVar8 >> 8);
        local_58[0xe] = (uchar)((ulong)lVar8 >> 0x10);
        local_58[0xf] = (uchar)((ulong)lVar8 >> 0x18);
        return;
      }
      uVar4 = 0xffffffffffffffff;
      do {
        uVar7 = uVar4;
        *(undefined1 *)((long)&local_88 + uVar7 + 1) = *(undefined1 *)((long)m + uVar7 + 1);
        uVar4 = uVar7 + 1;
      } while (uVar7 - inlen != -2);
      *(undefined1 *)((long)&local_88 + inlen) = 1;
      if (uVar7 + 1 < 0xe) {
        lVar8 = 0;
        if (inlen < 0xf) {
          lVar8 = 0xe - inlen;
        }
        memset((void *)((long)&local_88 + uVar7 + 3),0,lVar8 + 1);
      }
      uVar13 = (local_88 & 0x3ffffff) + uVar13;
      uVar3 = ((uint)(CONCAT44(local_84,local_88) >> 0x1a) & 0x3ffffff) + uVar3;
      uVar12 = ((uint)(CONCAT44(local_80,local_84) >> 0x14) & 0x3ffffff) + uVar12;
      uVar15 = ((uint)(CONCAT44(local_7c,local_80) >> 0xe) & 0x3ffffff) + uVar15;
      uVar6 = (local_7c >> 8) + uVar6;
      local_70 = 0;
      local_68 = (ulong *)m;
    }
  } while( true );
}

Assistant:

void
poly1305_auth(unsigned char out[POLY1305_TAGLEN], const unsigned char *m,
              size_t inlen, const unsigned char key[POLY1305_KEYLEN]) {
    uint32_t t0;
    uint32_t t1;
    uint32_t t2;
    uint32_t t3;
    uint32_t h0;
    uint32_t h1;
    uint32_t h2;
    uint32_t h3;
    uint32_t h4;
    uint32_t r0;
    uint32_t r1;
    uint32_t r2;
    uint32_t r3;
    uint32_t r4;
    uint32_t s1;
    uint32_t s2;
    uint32_t s3;
    uint32_t s4;
    uint32_t b;
    uint32_t nb;
    size_t j;
    uint64_t t[5];
    uint64_t f0;
    uint64_t f1;
    uint64_t f2;
    uint64_t f3;
    uint32_t g0;
    uint32_t g1;
    uint32_t g2;
    uint32_t g3;
    uint32_t g4;
    uint64_t c;
    unsigned char mp[16];

    /* clamp key */
    t0 = U8TO32_LE(key + 0);
    t1 = U8TO32_LE(key + 4);
    t2 = U8TO32_LE(key + 8);
    t3 = U8TO32_LE(key + 12);

    /* precompute multipliers */
    r0 = t0 & 0x3ffffff; t0 >>= 26; t0 |= t1 << 6;
    r1 = t0 & 0x3ffff03; t1 >>= 20; t1 |= t2 << 12;
    r2 = t1 & 0x3ffc0ff; t2 >>= 14; t2 |= t3 << 18;
    r3 = t2 & 0x3f03fff; t3 >>= 8;
    r4 = t3 & 0x00fffff;

    s1 = r1 * 5;
    s2 = r2 * 5;
    s3 = r3 * 5;
    s4 = r4 * 5;

    /* init state */
    h0 = 0;
    h1 = 0;
    h2 = 0;
    h3 = 0;
    h4 = 0;

    /* full blocks */
    if(inlen < 16)
        goto poly1305_donna_atmost15bytes;

poly1305_donna_16bytes:
    m += 16;
    inlen -= 16;

    t0 = U8TO32_LE(m-16);
    t1 = U8TO32_LE(m-12);
    t2 = U8TO32_LE(m-8);
    t3 = U8TO32_LE(m-4);

    h0 += t0 & 0x3ffffff;
    h1 += ((uint32_t)((((uint64_t)t1 << 32) | t0) >> 26) & 0x3ffffff);
    h2 += ((uint32_t)((((uint64_t)t2 << 32) | t1) >> 20) & 0x3ffffff);
    h3 += ((uint32_t)((((uint64_t)t3 << 32) | t2) >> 14) & 0x3ffffff);
    h4 += (t3 >> 8) | (1 << 24);


poly1305_donna_mul:
    t[0] = mul32x32_64(h0, r0) + mul32x32_64(h1, s4) + mul32x32_64(h2, s3) +
        mul32x32_64(h3, s2) + mul32x32_64(h4, s1);
    t[1] = mul32x32_64(h0, r1) + mul32x32_64(h1, r0) + mul32x32_64(h2, s4) +
        mul32x32_64(h3, s3) + mul32x32_64(h4, s2);
    t[2] = mul32x32_64(h0, r2) + mul32x32_64(h1, r1) + mul32x32_64(h2, r0) +
        mul32x32_64(h3, s4) + mul32x32_64(h4, s3);
    t[3] = mul32x32_64(h0, r3) + mul32x32_64(h1, r2) + mul32x32_64(h2, r1) +
        mul32x32_64(h3, r0) + mul32x32_64(h4, s4);
    t[4] = mul32x32_64(h0, r4) + mul32x32_64(h1, r3) + mul32x32_64(h2, r2) +
        mul32x32_64(h3, r1) + mul32x32_64(h4, r0);

    h0 = (uint32_t)t[0] & 0x3ffffff;
    c = (t[0] >> 26);

    t[1] += c;
    h1 = (uint32_t)t[1] & 0x3ffffff;
    b = (uint32_t)(t[1] >> 26);

    t[2] += b;
    h2 = (uint32_t)t[2] & 0x3ffffff;
    b = (uint32_t)(t[2] >> 26);

    t[3] += b;
    h3 = (uint32_t)t[3] & 0x3ffffff;
    b = (uint32_t)(t[3] >> 26);

    t[4] += b;
    h4 = (uint32_t)t[4] & 0x3ffffff;
    b = (uint32_t)(t[4] >> 26);

    h0 += b * 5;

    if(inlen >= 16)
        goto poly1305_donna_16bytes;

    /* final bytes */
poly1305_donna_atmost15bytes:
    if(!inlen)
        goto poly1305_donna_finish;

    for(j = 0; j < inlen; j++) mp[j] = m[j];
    mp[j++] = 1;
    for(; j < 16; j++)
        mp[j] = 0;

    inlen = 0;

    t0 = U8TO32_LE(mp + 0);
    t1 = U8TO32_LE(mp + 4);
    t2 = U8TO32_LE(mp + 8);
    t3 = U8TO32_LE(mp + 12);

    h0 += t0 & 0x3ffffff;
    h1 += ((uint32_t)((((uint64_t)t1 << 32) | t0) >> 26) & 0x3ffffff);
    h2 += ((uint32_t)((((uint64_t)t2 << 32) | t1) >> 20) & 0x3ffffff);
    h3 += ((uint32_t)((((uint64_t)t3 << 32) | t2) >> 14) & 0x3ffffff);
    h4 += (t3 >> 8);

    goto poly1305_donna_mul;

poly1305_donna_finish:
    b = h0 >> 26; h0 = h0 & 0x3ffffff;
    h1 +=     b; b = h1 >> 26; h1 = h1 & 0x3ffffff;
    h2 +=     b; b = h2 >> 26; h2 = h2 & 0x3ffffff;
    h3 +=     b; b = h3 >> 26; h3 = h3 & 0x3ffffff;
    h4 +=     b; b = h4 >> 26; h4 = h4 & 0x3ffffff;
    h0 += b * 5; b = h0 >> 26; h0 = h0 & 0x3ffffff;
    h1 +=     b;

    g0 = h0 + 5; b = g0 >> 26; g0 &= 0x3ffffff;
    g1 = h1 + b; b = g1 >> 26; g1 &= 0x3ffffff;
    g2 = h2 + b; b = g2 >> 26; g2 &= 0x3ffffff;
    g3 = h3 + b; b = g3 >> 26; g3 &= 0x3ffffff;
    g4 = h4 + b - (1 << 26);

    b = (g4 >> 31) - 1;
    nb = ~b;
    h0 = (h0 & nb) | (g0 & b);
    h1 = (h1 & nb) | (g1 & b);
    h2 = (h2 & nb) | (g2 & b);
    h3 = (h3 & nb) | (g3 & b);
    h4 = (h4 & nb) | (g4 & b);

    f0 = ((h0      ) | (h1 << 26)) + (uint64_t)U8TO32_LE(&key[16]);
    f1 = ((h1 >>  6) | (h2 << 20)) + (uint64_t)U8TO32_LE(&key[20]);
    f2 = ((h2 >> 12) | (h3 << 14)) + (uint64_t)U8TO32_LE(&key[24]);
    f3 = ((h3 >> 18) | (h4 <<  8)) + (uint64_t)U8TO32_LE(&key[28]);

    U32TO8_LE(&out[ 0], f0); f1 += (f0 >> 32);
    U32TO8_LE(&out[ 4], f1); f2 += (f1 >> 32);
    U32TO8_LE(&out[ 8], f2); f3 += (f2 >> 32);
    U32TO8_LE(&out[12], f3);
}